

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O1

void baryonyx::info<long_double,long_double,long_double>
               (context *ctx,char *fmt,longdouble *arg1,longdouble *args,longdouble *args_1)

{
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  text_style local_40;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_28;
  undefined2 local_20;
  undefined8 local_18;
  undefined2 local_10;
  
  if (5 < (int)ctx->log_priority) {
    local_40.background_color = *(color_type *)arg1;
    local_28 = *(anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                 *)args;
    local_18 = *(undefined8 *)args_1;
    local_40._16_2_ = SUB42(*(undefined4 *)((long)arg1 + 8),0);
    local_20 = (undefined2)*(undefined4 *)((long)args + 8);
    local_10 = (undefined2)*(undefined4 *)((long)args_1 + 8);
    args_00.field_1.args_ = local_28.args_;
    args_00.desc_ = (unsigned_long_long)&local_40.background_color;
    local_40.foreground_color = (color_type)fmt;
    ::fmt::v7::vprint<char_const*,char>
              (_stdout,(FILE *)(context::message_style + 0x78),&local_40,(char **)0xbbb,args_00);
  }
  return;
}

Assistant:

inline bool
is_loggable(context::message_type current_level, int level) noexcept
{
    return static_cast<int>(current_level) >= level;
}